

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,VirtualInterfaceType *type,string_view param_2)

{
  SymbolKind SVar1;
  FormatBuffer *pFVar2;
  char *begin;
  InstanceBodySymbol *pIVar3;
  size_type sVar4;
  pointer ppPVar5;
  long *plVar6;
  long lVar7;
  ParameterSymbol *this_00;
  ModportSymbol *pMVar8;
  Definition *pDVar9;
  Type *type_00;
  ConstantValue *this_01;
  ulong uVar10;
  long lVar11;
  FormatBuffer *this_02;
  ulong uVar12;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string local_58;
  VirtualInterfaceType *local_38;
  
  pFVar2 = (this->buffer)._M_t.
           super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
           _M_t.
           super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
           super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  pDVar9 = InstanceSymbol::getDefinition(type->iface);
  begin = (pDVar9->name)._M_str;
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)pFVar2,begin,begin + (pDVar9->name)._M_len);
  pIVar3 = type->iface->body;
  sVar4 = (pIVar3->parameters).size_;
  if (sVar4 != 0) {
    ppPVar5 = (pIVar3->parameters).data_;
    local_38 = type;
    ::fmt::v9::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"#(","");
    lVar11 = 0;
    do {
      plVar6 = *(long **)((long)ppPVar5 + lVar11);
      lVar7 = *plVar6;
      local_58._M_string_length = *(size_type *)(lVar7 + 8);
      local_58._M_dataplus._M_p = *(pointer *)(lVar7 + 0x10);
      fmt.size_ = 3;
      fmt.data_ = "{}=";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_58;
      args.desc_ = 0xd;
      ::fmt::v9::detail::vformat_to<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
                 (locale_ref)0x0);
      this_00 = (ParameterSymbol *)*plVar6;
      SVar1 = (this_00->super_ValueSymbol).super_Symbol.kind;
      if (SVar1 == TypeParameter) {
        type_00 = DeclaredType::getType
                            ((DeclaredType *)&(this_00->super_ValueSymbol).declaredType.typeOrLink);
        append(this,type_00);
      }
      else {
        if (SVar1 != Parameter) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,
                     "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ParameterSymbol]");
        }
        pFVar2 = (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
        this_01 = ParameterSymbol::getValue(this_00,(SourceRange)ZEXT816(0));
        ConstantValue::toString_abi_cxx11_(&local_58,this_01);
        ::fmt::v9::detail::buffer<char>::append<char>
                  ((buffer<char> *)pFVar2,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      ::fmt::v9::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,",","");
      lVar11 = lVar11 + 8;
    } while (sVar4 << 3 != lVar11);
    pFVar2 = (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    uVar10 = *(size_t *)((long)&(pFVar2->buf).super_buffer<char> + 0x18);
    uVar12 = *(size_t *)((long)&(pFVar2->buf).super_buffer<char> + 0x10) - 1;
    this_02 = pFVar2;
    if (uVar10 < uVar12) {
      (*(code *)*(pFVar2->buf).super_buffer<char>._vptr_buffer)(pFVar2,uVar12);
      uVar10 = *(size_t *)((long)&(pFVar2->buf).super_buffer<char> + 0x18);
      this_02 = (this->buffer)._M_t.
                super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    }
    if (uVar10 < uVar12) {
      uVar12 = uVar10;
    }
    *(ulong *)((long)&(pFVar2->buf).super_buffer<char> + 0x10) = uVar12;
    ::fmt::v9::detail::buffer<char>::append<char>((buffer<char> *)this_02,")","");
    type = local_38;
  }
  pMVar8 = type->modport;
  if (pMVar8 != (ModportSymbol *)0x0) {
    local_58._M_string_length = (pMVar8->super_Symbol).name._M_len;
    local_58._M_dataplus._M_p = (pMVar8->super_Symbol).name._M_str;
    fmt_00.size_ = 3;
    fmt_00.data_ = ".{}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_58;
    args_00.desc_ = 0xd;
    ::fmt::v9::detail::vformat_to<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt_00,args_00,
               (locale_ref)0x0);
  }
  return;
}

Assistant:

void TypePrinter::visit(const VirtualInterfaceType& type, string_view) {
    buffer->append(type.iface.getDefinition().name);

    auto params = type.iface.body.parameters;
    if (!params.empty()) {
        buffer->append("#(");
        for (auto param : params) {
            buffer->format("{}=", param->symbol.name);
            if (param->symbol.kind == SymbolKind::TypeParameter)
                append(param->symbol.as<TypeParameterSymbol>().targetType.getType());
            else
                buffer->append(param->symbol.as<ParameterSymbol>().getValue().toString());
            buffer->append(",");
        }

        buffer->pop_back();
        buffer->append(")");
    }

    if (type.modport)
        buffer->format(".{}", type.modport->name);
}